

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCleanCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,cmGeneratorTarget *target,char *filename)

{
  cmMakefile *this_00;
  byte bVar1;
  bool bVar2;
  string *psVar3;
  char *pcVar4;
  ostream *poVar5;
  cmOutputConverter *this_01;
  char *pcVar6;
  undefined1 auVar7 [16];
  string_view sVar8;
  string local_508 [32];
  string_view local_4e8;
  string local_4d8;
  allocator<char> local_4b1;
  string local_4b0;
  undefined1 local_490 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  string local_430;
  cmAlphaNum local_410;
  cmAlphaNum local_3e0;
  undefined1 local_3b0 [8];
  string remove;
  string local_380;
  undefined1 local_360 [8];
  string fc;
  string *file;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_300 [8];
  ofstream fout;
  cmAlphaNum local_e0;
  cmAlphaNum local_a0;
  undefined1 local_70 [8];
  string cleanfile;
  string currentBinDir;
  char *filename_local;
  cmGeneratorTarget *target_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *commands_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)(cleanfile.field_2._M_local_buf + 8),(string *)psVar3);
  cmAlphaNum::cmAlphaNum(&local_a0,(string *)(cleanfile.field_2._M_local_buf + 8));
  cmAlphaNum::cmAlphaNum(&local_e0,'/');
  (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xe])
            (&fout.field_0x1f8,this,target);
  pcVar6 = "/cmake_clean";
  cmStrCat<std::__cxx11::string,char[13]>
            ((string *)local_70,&local_a0,&local_e0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout.field_0x1f8,
             (char (*) [13])"/cmake_clean");
  std::__cxx11::string::~string((string *)&fout.field_0x1f8);
  if (filename != (char *)0x0) {
    std::__cxx11::string::operator+=((string *)local_70,"_");
    std::__cxx11::string::operator+=((string *)local_70,filename);
  }
  std::__cxx11::string::operator+=((string *)local_70,".cmake");
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_300,pcVar4,_S_out);
  bVar1 = std::ios::operator!((ios *)(local_300 + (long)*(_func_int **)((long)local_300 + -0x18)));
  if ((bVar1 & 1) != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
                   "Could not create ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    cmSystemTools::Error((string *)&__range2);
    std::__cxx11::string::~string((string *)&__range2);
  }
  bVar2 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(files);
  if (!bVar2) {
    std::operator<<((ostream *)local_300,"file(REMOVE_RECURSE\n");
    __end2 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(files);
    file = (string *)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(files);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&file), bVar2) {
      fc.field_2._8_8_ =
           std::
           _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&__end2);
      cmOutputConverter::MaybeRelativeToCurBinDir
                ((string *)local_360,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,(string *)fc.field_2._8_8_);
      poVar5 = std::operator<<((ostream *)local_300,"  ");
      auVar7 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_360);
      sVar8._M_len = auVar7._8_8_;
      remove.field_2._8_8_ = auVar7._0_8_;
      sVar8._M_str = (char *)0x0;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                (&local_380,(cmOutputConverter *)remove.field_2._8_8_,sVar8,(WrapQuotes)pcVar6);
      poVar5 = std::operator<<(poVar5,(string *)&local_380);
      std::operator<<(poVar5,"\n");
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)local_360);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    std::operator<<((ostream *)local_300,")\n");
  }
  cmAlphaNum::cmAlphaNum(&local_3e0,"$(CMAKE_COMMAND) -P ");
  this_01 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  cmOutputConverter::MaybeRelativeToCurBinDir
            ((string *)&languages._M_t._M_impl.super__Rb_tree_header._M_node_count,this_01,
             (string *)local_70);
  sVar8 = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&languages._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&local_430,this_01,sVar8,SHELL);
  cmAlphaNum::cmAlphaNum(&local_410,&local_430);
  cmStrCat<>((string *)local_3b0,&local_3e0,&local_410);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string
            ((string *)&languages._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(commands,(value_type *)local_3b0);
  std::__cxx11::string::~string((string *)local_3b0);
  if (filename == (char *)0x0) {
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_490);
    this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4b0,"CMAKE_BUILD_TYPE",&local_4b1);
    psVar3 = cmMakefile::GetSafeDefinition(this_00,&local_4b0);
    cmGeneratorTarget::GetLanguages
              (target,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_490,psVar3);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::allocator<char>::~allocator(&local_4b1);
    poVar5 = std::operator<<((ostream *)local_300,"\n");
    poVar5 = std::operator<<(poVar5,"# Per-language clean rules from dependency scanning.\n");
    poVar5 = std::operator<<(poVar5,"foreach(lang ");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_4e8," ");
    cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              (&local_4d8,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_490,local_4e8);
    poVar5 = std::operator<<(poVar5,(string *)&local_4d8);
    poVar5 = std::operator<<(poVar5,")\n");
    poVar5 = std::operator<<(poVar5,"  include(");
    (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xe])
              (local_508,this,target);
    poVar5 = std::operator<<(poVar5,local_508);
    poVar5 = std::operator<<(poVar5,"/cmake_clean_${lang}.cmake OPTIONAL)\n");
    std::operator<<(poVar5,"endforeach()\n");
    std::__cxx11::string::~string(local_508);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_490);
  }
  std::ofstream::~ofstream(local_300);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(cleanfile.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCleanCommand(
  std::vector<std::string>& commands, const std::set<std::string>& files,
  cmGeneratorTarget* target, const char* filename)
{
  std::string currentBinDir = this->GetCurrentBinaryDirectory();
  std::string cleanfile = cmStrCat(
    currentBinDir, '/', this->GetTargetDirectory(target), "/cmake_clean");
  if (filename) {
    cleanfile += "_";
    cleanfile += filename;
  }
  cleanfile += ".cmake";
  cmsys::ofstream fout(cleanfile.c_str());
  if (!fout) {
    cmSystemTools::Error("Could not create " + cleanfile);
  }
  if (!files.empty()) {
    fout << "file(REMOVE_RECURSE\n";
    for (std::string const& file : files) {
      std::string fc = this->MaybeRelativeToCurBinDir(file);
      fout << "  " << cmOutputConverter::EscapeForCMake(fc) << "\n";
    }
    fout << ")\n";
  }
  {
    std::string remove = cmStrCat(
      "$(CMAKE_COMMAND) -P ",
      this->ConvertToOutputFormat(this->MaybeRelativeToCurBinDir(cleanfile),
                                  cmOutputConverter::SHELL));
    commands.push_back(std::move(remove));
  }

  // For the main clean rule add per-language cleaning.
  if (!filename) {
    // Get the set of source languages in the target.
    std::set<std::string> languages;
    target->GetLanguages(
      languages, this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    /* clang-format off */
    fout << "\n"
         << "# Per-language clean rules from dependency scanning.\n"
         << "foreach(lang " << cmJoin(languages, " ") << ")\n"
         << "  include(" << this->GetTargetDirectory(target)
         << "/cmake_clean_${lang}.cmake OPTIONAL)\n"
         << "endforeach()\n";
    /* clang-format on */
  }
}